

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::GenerateDescriptors
          (SharedCodeGenerator *this,Printer *printer)

{
  SourceCodeInfo *this_00;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  FileDescriptor *pFVar4;
  string *psVar5;
  pointer this_01;
  size_type sVar6;
  reference pvVar7;
  FileDescriptor *file;
  string *dependency;
  undefined1 local_288 [4];
  int i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string full_name;
  string classname;
  string package;
  string filename;
  undefined1 local_180 [4];
  int i_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  dependencies;
  string local_148;
  int local_124;
  undefined1 local_120 [4];
  int i;
  string file_data;
  undefined1 local_f0 [8];
  FileDescriptorProto file_proto;
  Printer *printer_local;
  SharedCodeGenerator *this_local;
  
  file_proto.source_code_info_ = (SourceCodeInfo *)printer;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_f0);
  FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)local_f0);
  std::__cxx11::string::string((string *)local_120);
  MessageLite::SerializeToString((MessageLite *)local_f0,(string *)local_120);
  io::Printer::Print<>
            ((Printer *)file_proto.source_code_info_,"java.lang.String[] descriptorData = {\n");
  io::Printer::Indent((Printer *)file_proto.source_code_info_);
  for (local_124 = 0; uVar2 = (ulong)local_124, uVar3 = std::__cxx11::string::size(), uVar2 < uVar3;
      local_124 = local_124 + 0x28) {
    if (0 < local_124) {
      if (local_124 % 16000 == 0) {
        io::Printer::Print<>((Printer *)file_proto.source_code_info_,",\n");
      }
      else {
        io::Printer::Print<>((Printer *)file_proto.source_code_info_," +\n");
      }
    }
    this_00 = file_proto.source_code_info_;
    std::__cxx11::string::substr
              ((ulong)&dependencies.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_120);
    CEscape(&local_148,
            (string *)
            &dependencies.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)this_00,"\"$data$\"",(char (*) [5])0x77a837,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string
              ((string *)
               &dependencies.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  io::Printer::Outdent((Printer *)file_proto.source_code_info_);
  io::Printer::Print<>((Printer *)file_proto.source_code_info_,"\n};\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_180);
  for (filename.field_2._12_4_ = 0; iVar1 = FileDescriptor::dependency_count(this->file_),
      (int)filename.field_2._12_4_ < iVar1; filename.field_2._12_4_ = filename.field_2._12_4_ + 1) {
    pFVar4 = FileDescriptor::dependency(this->file_,filename.field_2._12_4_);
    psVar5 = FileDescriptor::name_abi_cxx11_(pFVar4);
    std::__cxx11::string::string((string *)(package.field_2._M_local_buf + 8),(string *)psVar5);
    pFVar4 = FileDescriptor::dependency(this->file_,filename.field_2._12_4_);
    FileJavaPackage_abi_cxx11_((string *)((long)&classname.field_2 + 8),(java *)pFVar4,file);
    this_01 = std::
              unique_ptr<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
              ::operator->(&this->name_resolver_);
    pFVar4 = FileDescriptor::dependency(this->file_,filename.field_2._12_4_);
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_
              ((string *)((long)&full_name.field_2 + 8),this_01,pFVar4);
    std::__cxx11::string::string((string *)local_208);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+(&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&classname.field_2 + 8),".");
      std::operator+(&local_228,&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&full_name.field_2 + 8));
      std::__cxx11::string::operator=((string *)local_208,(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
    }
    else {
      std::__cxx11::string::operator=
                ((string *)local_208,(string *)(full_name.field_2._M_local_buf + 8));
    }
    std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_288,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&package.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_180,(value_type *)local_288);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_288);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::~string((string *)(full_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(classname.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(package.field_2._M_local_buf + 8));
  }
  io::Printer::Print<>
            ((Printer *)file_proto.source_code_info_,
             "descriptor = com.google.protobuf.Descriptors.FileDescriptor\n  .internalBuildGeneratedFileFrom(descriptorData,\n"
            );
  io::Printer::Print<>
            ((Printer *)file_proto.source_code_info_,
             "    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");
  for (dependency._4_4_ = 0;
      sVar6 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_180), (ulong)(long)dependency._4_4_ < sVar6;
      dependency._4_4_ = dependency._4_4_ + 1) {
    pvVar7 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_180,(long)dependency._4_4_);
    io::Printer::Print<char[11],std::__cxx11::string>
              ((Printer *)file_proto.source_code_info_,"      $dependency$.getDescriptor(),\n",
               (char (*) [11])0x7cbc06,&pvVar7->second);
  }
  io::Printer::Print<>((Printer *)file_proto.source_code_info_,"    });\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_180);
  std::__cxx11::string::~string((string *)local_120);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_f0);
  return;
}

Assistant:

void SharedCodeGenerator::GenerateDescriptors(io::Printer* printer) {
  // Embed the descriptor.  We simply serialize the entire FileDescriptorProto
  // and embed it as a string literal, which is parsed and built into real
  // descriptors at initialization time.  We unfortunately have to put it in
  // a string literal, not a byte array, because apparently using a literal
  // byte array causes the Java compiler to generate *instructions* to
  // initialize each and every byte of the array, e.g. as if you typed:
  //   b[0] = 123; b[1] = 456; b[2] = 789;
  // This makes huge bytecode files and can easily hit the compiler's internal
  // code size limits (error "code to large").  String literals are apparently
  // embedded raw, which is what we want.
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);

  std::string file_data;
  file_proto.SerializeToString(&file_data);

  printer->Print("java.lang.String[] descriptorData = {\n");
  printer->Indent();

  // Limit the number of bytes per line.
  static const int kBytesPerLine = 40;
  // Limit the number of lines per string part.
  static const int kLinesPerPart = 400;
  // Every block of bytes, start a new string literal, in order to avoid the
  // 64k length limit. Note that this value needs to be <64k.
  static const int kBytesPerPart = kBytesPerLine * kLinesPerPart;
  for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
    if (i > 0) {
      if (i % kBytesPerPart == 0) {
        printer->Print(",\n");
      } else {
        printer->Print(" +\n");
      }
    }
    printer->Print("\"$data$\"", "data",
                   CEscape(file_data.substr(i, kBytesPerLine)));
  }

  printer->Outdent();
  printer->Print("\n};\n");

  // -----------------------------------------------------------------
  // Find out all dependencies.
  std::vector<std::pair<std::string, std::string> > dependencies;
  for (int i = 0; i < file_->dependency_count(); i++) {
    std::string filename = file_->dependency(i)->name();
    std::string package = FileJavaPackage(file_->dependency(i));
    std::string classname =
        name_resolver_->GetDescriptorClassName(file_->dependency(i));
    std::string full_name;
    if (package.empty()) {
      full_name = classname;
    } else {
      full_name = package + "." + classname;
    }
    dependencies.push_back(std::make_pair(filename, full_name));
  }

  // -----------------------------------------------------------------
  // Invoke internalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = com.google.protobuf.Descriptors.FileDescriptor\n"
      "  .internalBuildGeneratedFileFrom(descriptorData,\n");
  printer->Print(
      "    new com.google.protobuf.Descriptors.FileDescriptor[] {\n");

  for (int i = 0; i < dependencies.size(); i++) {
    const std::string& dependency = dependencies[i].second;
    printer->Print("      $dependency$.getDescriptor(),\n", "dependency",
                   dependency);
  }

  printer->Print("    });\n");
}